

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_param_test.cpp
# Opt level: O3

void __thiscall sign_verify_generic::test_method(sign_verify_generic *this)

{
  int iVar1;
  size_type sVar2;
  size_t siglen;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  size_t max_signature_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> serialized_private_key;
  vector<unsigned_char,_std::allocator<unsigned_char>_> serialized_public_key;
  picnic_publickey_t gen_public_key;
  array<unsigned_char,_32UL> m;
  picnic_l5_ur_publickey_t public_key;
  picnic_l5_ur_privatekey_t private_key;
  picnic_privatekey_t gen_private_key;
  assertion_result local_368;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  local_350;
  size_type local_340;
  char *local_338;
  char *local_330;
  assertion_result local_328;
  size_type local_310;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_308;
  undefined1 local_2e8 [16];
  undefined1 *local_2d8;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  *local_2d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2c8;
  assertion_result local_2b0 [3];
  array<unsigned_char,_32UL> local_268;
  value_expr<const_unsigned_long_&> local_248 [8];
  assertion_result local_208 [4];
  lazy_ostream local_1a8;
  undefined1 *local_198;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_190;
  const_string local_140;
  const_string local_130;
  const_string local_120;
  const_string local_110;
  const_string local_100;
  const_string local_f0;
  const_string local_e0;
  const_string local_d0;
  const_string local_c0;
  const_string local_b0;
  const_string local_a0;
  const_string local_90;
  const_string local_80;
  const_string local_70;
  const_string local_60;
  const_string local_50;
  const_string local_40;
  
  local_310 = picnic_l5_ur_signature_size();
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efc3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x39;
  local_248[0].m_value = &local_310;
  boost::test_tools::assertion::value_expr<const_unsigned_long_&>::evaluate
            (local_208,local_248,false);
  local_190 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2b0;
  local_2b0[0]._0_8_ = "max_signature_size";
  local_1a8.m_empty = false;
  local_1a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00179d08;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_40.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_40.m_end = "";
  local_2b0[0].m_message.px = (element_type *)0x159668;
  boost::test_tools::tt_detail::report_assertion
            (local_208,&local_1a8,&local_40,0x39,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_208[0].m_message.pn);
  (anonymous_namespace)::randomize_container<std::array<unsigned_char,32ul>>(&local_268);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efc3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x41;
  iVar1 = picnic_l5_ur_keygen(local_248,local_208);
  local_308.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = iVar1 == 0;
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (local_2b0,(value_expr<bool> *)&local_308,false);
  local_2e8._0_8_ = "!picnic_l5_ur_keygen(&public_key, &private_key)";
  local_1a8.m_empty = false;
  local_1a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00179d08;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_50.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_50.m_end = "";
  local_2e8._8_8_ = "";
  local_190 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2e8;
  boost::test_tools::tt_detail::report_assertion
            (local_2b0,&local_1a8,&local_50,0x41,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_2b0[0].m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efc3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x44;
  iVar1 = picnic_l5_ur_validate_keypair(local_208,local_248);
  local_308.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_308.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,iVar1 == 0);
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (local_2b0,(value_expr<bool> *)&local_308,false);
  local_2e8._0_8_ = "!picnic_l5_ur_validate_keypair(&private_key, &public_key)";
  local_1a8.m_empty = false;
  local_1a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00179d08;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_60.m_end = "";
  local_2e8._8_8_ = "";
  local_190 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2e8;
  boost::test_tools::tt_detail::report_assertion
            (local_2b0,&local_1a8,&local_60,0x44,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_2b0[0].m_message.pn);
  local_308.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_308.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_308.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar2 = picnic_l5_ur_get_private_key_size();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_308,sVar2);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efc3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x4b;
  iVar1 = picnic_l5_ur_write_private_key
                    (local_208,
                     local_308.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)local_308.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_308.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  local_2e8._8_8_ =
       (long)local_308.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_308.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_2e8._0_4_ = iVar1;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
  ::evaluate(local_2b0,
             (binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
              *)local_2e8,false);
  local_190 = &local_2c8;
  local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       "picnic_l5_ur_write_private_key(&private_key, serialized_private_key.data(), serialized_private_key.size()) == serialized_private_key.size()"
  ;
  local_1a8.m_empty = false;
  local_1a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00179d08;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_70.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_70.m_end = "";
  local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "";
  boost::test_tools::tt_detail::report_assertion
            (local_2b0,&local_1a8,&local_70,0x4b,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_2b0[0].m_message.pn);
  local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sVar2 = picnic_l5_ur_get_public_key_size();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_2c8,sVar2);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efc3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x51;
  local_2e8._0_4_ =
       picnic_l5_ur_write_public_key
                 (local_248,
                  local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start,
                  (long)local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  local_2e8._8_8_ =
       (long)local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
  ::evaluate(local_2b0,
             (binary_expr<boost::test_tools::assertion::value_expr<int>,_unsigned_long,_boost::test_tools::assertion::op::EQ<int,_unsigned_long,_void>_>
              *)local_2e8,false);
  local_190 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_328;
  local_328._0_8_ =
       "picnic_l5_ur_write_public_key(&public_key, serialized_public_key.data(), serialized_public_key.size()) == serialized_public_key.size()"
  ;
  local_1a8.m_empty = false;
  local_1a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00179d08;
  local_198 = boost::unit_test::lazy_ostream::inst;
  local_80.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_80.m_end = "";
  local_328.m_message.px = (element_type *)0x1597d9;
  boost::test_tools::tt_detail::report_assertion
            (local_2b0,&local_1a8,&local_80,0x51,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_2b0[0].m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efc3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x57;
  iVar1 = picnic_read_private_key
                    (&local_1a8,
                     local_308.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)local_308.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_308.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  local_350.m_lhs.m_value._0_1_ = iVar1 == 0;
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (&local_328,(value_expr<bool> *)&local_350,false);
  local_368._0_8_ =
       "!picnic_read_private_key(&gen_private_key, serialized_private_key.data(), serialized_private_key.size())"
  ;
  local_2e8._8_8_ = local_2e8._8_8_ & 0xffffffffffffff00;
  local_2e8._0_8_ = &PTR__lazy_ostream_00179d08;
  local_2d8 = boost::unit_test::lazy_ostream::inst;
  local_90.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_90.m_end = "";
  local_368.m_message.px = (element_type *)0x159842;
  local_2d0 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
               *)&local_368;
  boost::test_tools::tt_detail::report_assertion
            (&local_328,(lazy_ostream *)local_2e8,&local_90,0x57,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_328.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efc3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x59;
  iVar1 = picnic_read_public_key
                    (local_2b0,
                     local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)local_2c8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_2c8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
  local_350.m_lhs.m_value._0_1_ = iVar1 == 0;
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (&local_328,(value_expr<bool> *)&local_350,false);
  local_368._0_8_ =
       "!picnic_read_public_key(&gen_public_key, serialized_public_key.data(), serialized_public_key.size())"
  ;
  local_2e8._8_8_ = local_2e8._8_8_ & 0xffffffffffffff00;
  local_2e8._0_8_ = &PTR__lazy_ostream_00179d08;
  local_2d8 = boost::unit_test::lazy_ostream::inst;
  local_a0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_a0.m_end = "";
  local_368.m_message.px = (element_type *)0x1598a7;
  local_2d0 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
               *)&local_368;
  boost::test_tools::tt_detail::report_assertion
            (&local_328,(lazy_ostream *)local_2e8,&local_a0,0x59,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_328.m_message.pn);
  local_328.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_328._0_8_ = (pointer)0x0;
  local_328.m_message.px = (element_type *)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_328,local_310);
  local_340 = local_310;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efc3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x60;
  iVar1 = picnic_l5_ur_sign(local_208,&local_268,0x20,local_328._0_8_,&local_340);
  local_338 = (char *)CONCAT71(local_338._1_7_,iVar1 == 0);
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (&local_368,(value_expr<bool> *)&local_338,false);
  local_350.m_lhs.m_value = (unsigned_long *)0x1595f7;
  local_2e8._8_8_ = local_2e8._8_8_ & 0xffffffffffffff00;
  local_b0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_2e8._0_8_ = &PTR__lazy_ostream_00179d08;
  local_b0.m_end = "";
  local_350.m_rhs = (unsigned_long *)0x159640;
  local_2d8 = boost::unit_test::lazy_ostream::inst;
  local_2d0 = &local_350;
  boost::test_tools::tt_detail::report_assertion
            (&local_368,(lazy_ostream *)local_2e8,&local_b0,0x60,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_368.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efc3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x61;
  local_350.m_rhs = (unsigned_long *)((ulong)local_350.m_rhs & 0xffffffff00000000);
  local_350.m_lhs.m_value = &local_340;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
  ::evaluate(&local_368,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
              *)&local_350,false);
  local_338 = "siglen > 0";
  local_2e8._8_8_ = local_2e8._8_8_ & 0xffffffffffffff00;
  local_c0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_2e8._0_8_ = &PTR__lazy_ostream_00179d08;
  local_c0.m_end = "";
  local_330 = "";
  local_2d8 = boost::unit_test::lazy_ostream::inst;
  local_2d0 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
               *)&local_338;
  boost::test_tools::tt_detail::report_assertion
            (&local_368,(lazy_ostream *)local_2e8,&local_c0,0x61,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_368.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efc3);
  local_350.m_rhs = &local_310;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x62;
  local_350.m_lhs.m_value = &local_340;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_368,&local_350,false);
  local_338 = "siglen <= max_signature_size";
  local_2e8._8_8_ = local_2e8._8_8_ & 0xffffffffffffff00;
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_2e8._0_8_ = &PTR__lazy_ostream_00179d08;
  local_d0.m_end = "";
  local_330 = "";
  local_2d8 = boost::unit_test::lazy_ostream::inst;
  local_2d0 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
               *)&local_338;
  boost::test_tools::tt_detail::report_assertion
            (&local_368,(lazy_ostream *)local_2e8,&local_d0,0x62,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_368.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efc3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 100;
  iVar1 = picnic_l5_ur_verify(local_248,&local_268,0x20,local_328._0_8_,local_340);
  local_338._0_1_ = iVar1 == 0;
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (&local_368,(value_expr<bool> *)&local_338,false);
  local_350.m_lhs.m_value = (unsigned_long *)0x159669;
  local_2e8._8_8_ = local_2e8._8_8_ & 0xffffffffffffff00;
  local_e0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_2e8._0_8_ = &PTR__lazy_ostream_00179d08;
  local_e0.m_end = "";
  local_350.m_rhs = (unsigned_long *)0x1596b2;
  local_2d8 = boost::unit_test::lazy_ostream::inst;
  local_2d0 = &local_350;
  boost::test_tools::tt_detail::report_assertion
            (&local_368,(lazy_ostream *)local_2e8,&local_e0,100,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_368.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efc3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x65;
  iVar1 = picnic_verify(local_2b0,&local_268,0x20,local_328._0_8_,local_340);
  local_338._0_1_ = iVar1 == 0;
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (&local_368,(value_expr<bool> *)&local_338,false);
  local_350.m_lhs.m_value = (unsigned_long *)0x1598a8;
  local_2e8._8_8_ = local_2e8._8_8_ & 0xffffffffffffff00;
  local_f0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_2e8._0_8_ = &PTR__lazy_ostream_00179d08;
  local_f0.m_end = "";
  local_350.m_rhs = (unsigned_long *)0x1598ef;
  local_2d8 = boost::unit_test::lazy_ostream::inst;
  local_2d0 = &local_350;
  boost::test_tools::tt_detail::report_assertion
            (&local_368,(lazy_ostream *)local_2e8,&local_f0,0x65,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_368.m_message.pn);
  local_340 = local_310;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efc3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x69;
  iVar1 = picnic_sign(&local_1a8,&local_268,0x20,local_328._0_8_,&local_340);
  local_338 = (char *)CONCAT71(local_338._1_7_,iVar1 == 0);
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (&local_368,(value_expr<bool> *)&local_338,false);
  local_350.m_lhs.m_value = (unsigned_long *)0x1598f0;
  local_2e8._8_8_ = local_2e8._8_8_ & 0xffffffffffffff00;
  local_100.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_2e8._0_8_ = &PTR__lazy_ostream_00179d08;
  local_100.m_end = "";
  local_350.m_rhs = (unsigned_long *)0x159937;
  local_2d8 = boost::unit_test::lazy_ostream::inst;
  local_2d0 = &local_350;
  boost::test_tools::tt_detail::report_assertion
            (&local_368,(lazy_ostream *)local_2e8,&local_100,0x69,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_368.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efc3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x6a;
  local_350.m_rhs = (unsigned_long *)((ulong)local_350.m_rhs & 0xffffffff00000000);
  local_350.m_lhs.m_value = &local_340;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
  ::evaluate(&local_368,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
              *)&local_350,false);
  local_338 = "siglen > 0";
  local_2e8._8_8_ = local_2e8._8_8_ & 0xffffffffffffff00;
  local_110.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_2e8._0_8_ = &PTR__lazy_ostream_00179d08;
  local_110.m_end = "";
  local_330 = "";
  local_2d8 = boost::unit_test::lazy_ostream::inst;
  local_2d0 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
               *)&local_338;
  boost::test_tools::tt_detail::report_assertion
            (&local_368,(lazy_ostream *)local_2e8,&local_110,0x6a,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_368.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efc3);
  local_350.m_rhs = &local_310;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x6b;
  local_350.m_lhs.m_value = &local_340;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_368,&local_350,false);
  local_338 = "siglen <= max_signature_size";
  local_2e8._8_8_ = local_2e8._8_8_ & 0xffffffffffffff00;
  local_120.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_2e8._0_8_ = &PTR__lazy_ostream_00179d08;
  local_120.m_end = "";
  local_330 = "";
  local_2d8 = boost::unit_test::lazy_ostream::inst;
  local_2d0 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
               *)&local_338;
  boost::test_tools::tt_detail::report_assertion
            (&local_368,(lazy_ostream *)local_2e8,&local_120,0x6b,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_368.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efc3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x6d;
  iVar1 = picnic_l5_ur_verify(local_248,&local_268,0x20,local_328._0_8_,local_340);
  local_338._0_1_ = iVar1 == 0;
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (&local_368,(value_expr<bool> *)&local_338,false);
  local_350.m_lhs.m_value = (unsigned_long *)0x159669;
  local_2e8._8_8_ = local_2e8._8_8_ & 0xffffffffffffff00;
  local_130.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_2e8._0_8_ = &PTR__lazy_ostream_00179d08;
  local_130.m_end = "";
  local_350.m_rhs = (unsigned_long *)0x1596b2;
  local_2d8 = boost::unit_test::lazy_ostream::inst;
  local_2d0 = &local_350;
  boost::test_tools::tt_detail::report_assertion
            (&local_368,(lazy_ostream *)local_2e8,&local_130,0x6d,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_368.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efc3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x6e;
  iVar1 = picnic_verify(local_2b0,&local_268,0x20,local_328._0_8_,local_340);
  local_338 = (char *)CONCAT71(local_338._1_7_,iVar1 == 0);
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (&local_368,(value_expr<bool> *)&local_338,false);
  local_350.m_lhs.m_value = (unsigned_long *)0x1598a8;
  local_2e8._8_8_ = local_2e8._8_8_ & 0xffffffffffffff00;
  local_140.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_2e8._0_8_ = &PTR__lazy_ostream_00179d08;
  local_140.m_end = "";
  local_350.m_rhs = (unsigned_long *)0x1598ef;
  local_2d8 = boost::unit_test::lazy_ostream::inst;
  local_2d0 = &local_350;
  boost::test_tools::tt_detail::report_assertion
            (&local_368,(lazy_ostream *)local_2e8,&local_140,0x6e,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_368.m_message.pn);
  if ((pointer)local_328._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_328._0_8_);
  }
  if (local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2c8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_308.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_308.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(sign_verify_generic) {
  const size_t max_signature_size = PICNIC_CONCAT(PARAM, signature_size)();
  BOOST_TEST(max_signature_size);

  std::array<uint8_t, 32> m;
  randomize_container(m);

  // Create a key pair
  PICNIC_CONCAT(PARAM, privatekey_t) private_key;
  PICNIC_CONCAT(PARAM, publickey_t) public_key;
  BOOST_TEST(!PICNIC_CONCAT(PARAM, keygen)(&public_key, &private_key));

  // Valid key pair
  BOOST_TEST(!PICNIC_CONCAT(PARAM, validate_keypair)(&private_key, &public_key));

  // Serialize key pair
  std::vector<uint8_t> serialized_private_key;
  serialized_private_key.resize(PICNIC_CONCAT(PARAM, get_private_key_size()));
  BOOST_TEST(PICNIC_CONCAT(PARAM, write_private_key)(&private_key, serialized_private_key.data(),
                                                     serialized_private_key.size()) ==
             serialized_private_key.size());

  std::vector<uint8_t> serialized_public_key;
  serialized_public_key.resize(PICNIC_CONCAT(PARAM, get_public_key_size()));
  BOOST_TEST(PICNIC_CONCAT(PARAM, write_public_key)(&public_key, serialized_public_key.data(),
                                                    serialized_public_key.size()) ==
             serialized_public_key.size());

  // Deserialize key pair
  picnic_privatekey_t gen_private_key;
  picnic_publickey_t gen_public_key;
  BOOST_TEST(!picnic_read_private_key(&gen_private_key, serialized_private_key.data(),
                                      serialized_private_key.size()));
  BOOST_TEST(!picnic_read_public_key(&gen_public_key, serialized_public_key.data(),
                                     serialized_public_key.size()));

  std::vector<uint8_t> sig;
  sig.resize(max_signature_size);
  size_t siglen = max_signature_size;

  // Sign a message
  BOOST_TEST(!PICNIC_CONCAT(PARAM, sign)(&private_key, m.data(), m.size(), sig.data(), &siglen));
  BOOST_TEST(siglen > 0);
  BOOST_TEST(siglen <= max_signature_size);
  // Verify signature
  BOOST_TEST(!PICNIC_CONCAT(PARAM, verify)(&public_key, m.data(), m.size(), sig.data(), siglen));
  BOOST_TEST(!picnic_verify(&gen_public_key, m.data(), m.size(), sig.data(), siglen));

  siglen = max_signature_size;
  // Sign another message
  BOOST_TEST(!picnic_sign(&gen_private_key, m.data(), m.size(), sig.data(), &siglen));
  BOOST_TEST(siglen > 0);
  BOOST_TEST(siglen <= max_signature_size);
  // Verify signature
  BOOST_TEST(!PICNIC_CONCAT(PARAM, verify)(&public_key, m.data(), m.size(), sig.data(), siglen));
  BOOST_TEST(!picnic_verify(&gen_public_key, m.data(), m.size(), sig.data(), siglen));
}